

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O3

DdNode * Cudd_BddToAdd(DdManager *dd,DdNode *B)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = ddBddToAddRecur(dd,B);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_BddToAdd(
  DdManager * dd,
  DdNode * B)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = ddBddToAddRecur(dd, B);
    } while (dd->reordered ==1);
    return(res);

}